

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Type type_00;
  Expression *local_c0;
  Type local_80;
  Expression *local_78;
  Expression *ret;
  TranslateToFuzzReader *local_68;
  BasicType local_5c;
  TranslateToFuzzReader *local_58;
  TranslateToFuzzReader *local_50;
  undefined4 local_44;
  TranslateToFuzzReader *local_40;
  TrivialNester local_28;
  TrivialNester nester;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  nester.parent = this;
  this_local = (TranslateToFuzzReader *)type.id;
  makeTrivial(wasm::Type)::TrivialNester::TrivialNester(wasm::TranslateToFuzzReader__
            (&local_28,this);
  bVar1 = Type::isConcrete((Type *)&this_local);
  if (bVar1) {
    if (this->funcContext != (FunctionCreationContext *)0x0) {
      bVar1 = Type::isNonNullable((Type *)&this_local);
      bVar1 = oneIn(this,(uint)bVar1 * 8 + 2);
      if (bVar1) {
        local_40 = this_local;
        type_local.id = (uintptr_t)makeLocalGet(this,(Type)this_local);
        goto LAB_001b23eb;
      }
    }
    bVar1 = oneIn(this,2);
    if (bVar1) {
      local_50 = this_local;
      local_c0 = makeConst(this,(Type)this_local);
    }
    else {
      local_58 = this_local;
      local_c0 = makeGlobalGet(this,(Type)this_local);
    }
    type_local.id = (uintptr_t)local_c0;
  }
  else {
    local_5c = none;
    bVar1 = Type::operator==((Type *)&this_local,&local_5c);
    if (bVar1) {
      local_68 = this_local;
      type_local.id = (uintptr_t)makeNop(this,(Type)this_local);
    }
    else {
      ret._4_4_ = 1;
      bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ret + 4));
      if (!bVar1) {
        __assert_fail("type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x8ee,"Expression *wasm::TranslateToFuzzReader::makeTrivial(Type)");
      }
      local_78 = (Expression *)0x0;
      local_80 = Function::getResults(this->funcContext->func);
      bVar1 = Type::isConcrete(&local_80);
      if (bVar1) {
        type_00 = Function::getResults(this->funcContext->func);
        local_78 = makeTrivial(this,type_00);
      }
      type_local.id = (uintptr_t)Builder::makeReturn(&this->builder,local_78);
    }
  }
LAB_001b23eb:
  local_44 = 1;
  makeTrivial::TrivialNester::~TrivialNester(&local_28);
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  struct TrivialNester {
    TranslateToFuzzReader& parent;
    TrivialNester(TranslateToFuzzReader& parent) : parent(parent) {
      parent.trivialNesting++;
    }
    ~TrivialNester() { parent.trivialNesting--; }
  } nester(*this);

  if (type.isConcrete()) {
    // If we have a function context, use a local half the time. Use a local
    // less often if the local is non-nullable, however, as then we might be
    // using it before it was set, which would trap.
    if (funcContext && oneIn(type.isNonNullable() ? 10 : 2)) {
      return makeLocalGet(type);
    }

    // Either make a const, or a global.get (which may fail to find a suitable
    // global, especially in a non-function context, and if so it will make a
    // constant instead).
    return oneIn(2) ? makeConst(type) : makeGlobalGet(type);
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}